

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbbt.c
# Opt level: O1

unsigned_long clipping_Xbitblt(DspInterface dsp,DLword *dummy,int x,int y,int w,int h)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  unsigned_long uVar4;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  GC p_Var5;
  int iVar6;
  uint uVar7;
  int iVar9;
  Window WVar10;
  int iVar11;
  Display *pDVar12;
  undefined4 in_register_00000084;
  ulong uVar13;
  undefined4 in_register_0000008c;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  ulong uVar8;
  
  uVar14 = CONCAT44(in_register_0000008c,h);
  uVar8 = CONCAT44(in_register_00000084,w);
  uVar13 = CONCAT44(in_register_00000014,x);
  uVar15 = CONCAT44(in_register_0000000c,y);
  uVar1 = (dsp->Visible).x;
  uVar2 = (dsp->Visible).y;
  iVar6 = (dsp->Visible).width + uVar1;
  iVar16 = (dsp->Visible).height + uVar2;
  iVar9 = w + x;
  iVar3 = h + y;
  if (y < iVar16 && (((int)uVar2 < iVar3 && (int)uVar1 < iVar9) && x < iVar6)) {
    iVar11 = x - uVar1;
    iVar17 = y - uVar2;
    if (iVar16 < iVar3 || ((y < (int)uVar2 || x < (int)uVar1) || iVar6 < iVar9)) {
      iVar11 = x - uVar1;
      if ((int)uVar1 <= x) {
        iVar11 = 0;
      }
      iVar17 = iVar6 - iVar9;
      if (iVar9 <= iVar6) {
        iVar17 = 0;
      }
      uVar7 = iVar17 + iVar11 + w;
      uVar8 = (ulong)uVar7;
      iVar6 = y - uVar2;
      if ((int)uVar2 <= y) {
        iVar6 = 0;
      }
      iVar9 = iVar16 - iVar3;
      if (iVar3 <= iVar16) {
        iVar9 = 0;
      }
      if ((int)uVar7 < 1) {
        return 1;
      }
      uVar7 = iVar6 + h + iVar9;
      uVar14 = (ulong)uVar7;
      if ((int)uVar7 < 1) {
        return 1;
      }
      uVar15 = (ulong)(uint)y;
      if (y < (int)uVar2) {
        uVar15 = (ulong)uVar2;
      }
      uVar13 = (ulong)(uint)x;
      if (x < (int)uVar1) {
        uVar13 = (ulong)uVar1;
      }
      pDVar12 = dsp->display_id;
      WVar10 = dsp->DisplayWindow;
      p_Var5 = dsp->Copy_GC;
      iVar11 = (int)uVar13 - uVar1;
      iVar17 = (int)uVar15 - uVar2;
    }
    else {
      pDVar12 = dsp->display_id;
      WVar10 = dsp->DisplayWindow;
      p_Var5 = dsp->Copy_GC;
    }
    XPutImage(pDVar12,WVar10,p_Var5,&dsp->ScreenBitmap,uVar13,uVar15,iVar11,iVar17,uVar8,uVar14);
    XFlush(dsp->display_id);
    uVar4 = 1;
  }
  else {
    uVar4 = 0;
  }
  return uVar4;
}

Assistant:

unsigned long clipping_Xbitblt(DspInterface dsp, DLword *dummy, int x, int y, int w, int h)
{
  int temp_x, temp_y, LowerRightX, LowerRightY;

  LowerRightX = dsp->Visible.x + (int)dsp->Visible.width - 1;
  LowerRightY = dsp->Visible.y + (int)dsp->Visible.height - 1;

  /* display region of interest lower right x, y pixel */
  temp_x = x + w - 1;
  temp_y = y + h - 1;

  /* if the display region of interest is completely outside the visible window */
  if ((temp_x < dsp->Visible.x) || (x > LowerRightX) || (temp_y < dsp->Visible.y) ||
      (y > LowerRightY))
    return (0);

  /* if the display region of interest is completely within the visible window */
  if ((x >= dsp->Visible.x) && (temp_x <= LowerRightX) && (y >= dsp->Visible.y) &&
      (temp_y <= LowerRightY)) {
    XLOCK;
    XPutImage(dsp->display_id, dsp->DisplayWindow, dsp->Copy_GC, &dsp->ScreenBitmap, x, y,
              x - dsp->Visible.x, y - dsp->Visible.y, (unsigned)w, (unsigned)h);
    XFlush(dsp->display_id);
    XUNLOCK(dsp);
    return (1);
  }

  /* clip left to visible window */
  if (x < dsp->Visible.x) {
    w -= dsp->Visible.x - x;
    x = dsp->Visible.x;
  }

  /* clip right to visible window */
  if (temp_x > LowerRightX) w -= temp_x - LowerRightX;

  /* clip top to visible window */
  if (y < dsp->Visible.y) {
    h -= dsp->Visible.y - y;
    y = dsp->Visible.y;
  }

  /* clip bottom to visible window */
  if (temp_y > LowerRightY) h -= temp_y - LowerRightY;

  if ((w > 0) && (h > 0)) {
    XLOCK;
    XPutImage(dsp->display_id, dsp->DisplayWindow, dsp->Copy_GC, &dsp->ScreenBitmap, x, y,
              x - dsp->Visible.x, y - dsp->Visible.y, (unsigned)w, (unsigned)h);
    XFlush(dsp->display_id);
    XUNLOCK(dsp);
  }
  return (1);

}